

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

Try<int> * __thiscall
async_simple::coro::detail::
LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>::awaitResume
          (LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_> *this)

{
  coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>_>
  *in_RSI;
  Try<int> *in_RDI;
  Try<int> r;
  Try<int> *this_00;
  LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>
  *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>_>
  ::promise(in_RSI);
  LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>::result
            (in_stack_ffffffffffffffd0);
  Try<std::pair<std::error_code,_unsigned_long>_>::Try(this_00,in_RDI);
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>_>
  ::destroy((coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>_>
             *)0x1b4948);
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>_>
  ::operator=(in_RSI,(nullptr_t)0x0);
  Try<std::pair<std::error_code,_unsigned_long>_>::Try(this_00,in_RDI);
  Try<std::pair<std::error_code,_unsigned_long>_>::~Try((Try<int> *)0x1b4970);
  return this_00;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }